

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

BloomFilter snap_renamefilter(GCtrace *T,SnapNo lim)

{
  IRIns *local_28;
  IRIns *ir;
  BloomFilter rfilt;
  SnapNo lim_local;
  GCtrace *T_local;
  
  ir = (IRIns *)0x0;
  for (local_28 = T->ir + (T->nins - 1); (local_28->field_1).o == '\x14'; local_28 = local_28 + -1)
  {
    if ((local_28->field_0).op2 <= lim) {
      ir = (IRIns *)(1L << ((byte)(local_28->field_0).op1 & 0x3f) | (ulong)ir);
    }
  }
  return (BloomFilter)ir;
}

Assistant:

static BloomFilter snap_renamefilter(GCtrace *T, SnapNo lim)
{
  BloomFilter rfilt = 0;
  IRIns *ir;
  for (ir = &T->ir[T->nins-1]; ir->o == IR_RENAME; ir--)
    if (ir->op2 <= lim)
      bloomset(rfilt, ir->op1);
  return rfilt;
}